

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
cs::compiler_type::build_tree
          (compiler_type *this,tree_type<cs::token_base_*> *tree,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *signals,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *objects)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  compiler_type *this_00;
  size_type sVar5;
  undefined8 uVar6;
  undefined8 in_RCX;
  compile_error *in_RSI;
  iterator it_3;
  iterator it_2;
  iterator it_1;
  size_t i;
  tree_type<cs::token_base_*> t;
  token_base **it;
  iterator __end4;
  iterator __begin4;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *__range4;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *list;
  iterator __end3;
  iterator __begin3;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *__range3;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tokens;
  token_sblist *sbl;
  token_base **obj;
  iterator __end1;
  iterator __begin1;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *__range1;
  _Self *in_stack_fffffffffffffcd8;
  compile_error *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  compile_error *in_stack_fffffffffffffcf0;
  compile_error *this_01;
  undefined8 in_stack_fffffffffffffd28;
  compile_error *this_02;
  token_signal *in_stack_fffffffffffffd30;
  iterator in_stack_fffffffffffffd38;
  tree_type<cs::token_base_*> *in_stack_fffffffffffffd40;
  iterator in_stack_fffffffffffffd48;
  token_base *in_stack_fffffffffffffd58;
  allocator *paVar7;
  iterator local_278;
  iterator local_270;
  tree_node *local_268;
  tree_node *local_260;
  tree_node *local_258;
  tree_node *local_250;
  tree_node *local_248;
  tree_node *local_240;
  tree_node *local_238;
  tree_node *local_230;
  tree_node *local_228;
  iterator local_220;
  iterator local_218;
  tree_node *local_210;
  tree_node *local_208;
  tree_node *local_200;
  iterator local_1f8;
  iterator local_1f0;
  ulong local_1e8;
  tree_node *local_1e0;
  tree_node *local_1d8;
  tree_node *local_1d0;
  tree_node *local_1c8;
  undefined1 local_1b9;
  tree_node local_1b0;
  _Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> local_178;
  reference local_158;
  reference local_150;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffee0;
  _Elt_pointer in_stack_fffffffffffffee8;
  compiler_type *in_stack_fffffffffffffef0;
  tree_type<cs::token_base_*> local_100 [10];
  token_sblist *local_b0;
  reference local_a8;
  _Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> local_80;
  undefined8 local_60;
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  undefined8 local_20;
  compile_error *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  bVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::empty
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x5d7a34);
  if ((!bVar2) &&
     (bVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::empty
                        ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x5d7a45),
     !bVar2)) {
    this_00 = (compiler_type *)
              std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                        ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x5d7a56);
    sVar5 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x5d7a6b);
    if (this_00 == (compiler_type *)(sVar5 + 1)) {
      local_60 = local_20;
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::begin
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_fffffffffffffcd8);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::end
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_fffffffffffffcd8);
      while (bVar2 = std::operator!=((_Self *)in_stack_fffffffffffffce0,
                                     (_Self *)in_stack_fffffffffffffcd8), bVar2) {
        local_a8 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                   operator*(&local_80);
        if ((*local_a8 != (token_base *)0x0) &&
           (iVar3 = (*(*local_a8)->_vptr_token_base[2])(), iVar3 == 9)) {
          local_b0 = (token_sblist *)*local_a8;
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x5d7c1c);
          token_sblist::get_list(local_b0);
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::begin((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                   *)in_stack_fffffffffffffcd8);
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::end((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)in_stack_fffffffffffffcd8);
          while (bVar2 = std::operator!=((_Self *)in_stack_fffffffffffffce0,
                                         in_stack_fffffffffffffcd8), bVar2) {
            local_158 = std::
                        _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
                        ::operator*((_Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
                                     *)&stack0xfffffffffffffed8);
            local_150 = local_158;
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::begin
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffcd8);
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::end
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffcd8);
            while (bVar2 = std::operator!=((_Self *)in_stack_fffffffffffffce0,
                                           (_Self *)in_stack_fffffffffffffcd8), bVar2) {
              local_1b0.right =
                   (tree_node *)
                   std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                   operator*(&local_178);
              std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                        ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                         in_stack_fffffffffffffce0,(value_type *)in_stack_fffffffffffffcd8);
              std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
              operator++((_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> *)
                         in_stack_fffffffffffffce0);
            }
            in_stack_fffffffffffffd48.mData =
                 (tree_node *)token_base::operator_new((size_t)in_stack_fffffffffffffce0);
            token_signal::token_signal
                      (in_stack_fffffffffffffd30,
                       (signal_types)((ulong)in_stack_fffffffffffffd28 >> 0x20));
            local_1b0.left = in_stack_fffffffffffffd48.mData;
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffce0,(value_type *)in_stack_fffffffffffffcd8);
            std::
            _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
            ::operator++((_Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
                          *)in_stack_fffffffffffffce0);
          }
          in_stack_fffffffffffffd40 = local_100;
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::pop_back
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                     in_stack_fffffffffffffce0);
          in_stack_fffffffffffffd38.mData = &local_1b0;
          tree_type<cs::token_base_*>::tree_type
                    ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd38.mData);
          gen_tree(in_stack_fffffffffffffef0,
                   (tree_type<cs::token_base_*> *)in_stack_fffffffffffffee8,
                   in_stack_fffffffffffffee0);
          in_stack_fffffffffffffd30 =
               (token_signal *)token_base::operator_new((size_t)in_stack_fffffffffffffce0);
          local_1b9 = 1;
          tree_type<cs::token_base_*>::tree_type
                    ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffce0,
                     (tree_type<cs::token_base_*> *)in_stack_fffffffffffffcd8);
          token_expr::token_expr
                    ((token_expr *)in_stack_fffffffffffffcf0,
                     (tree_type<cs::token_base_*> *)
                     CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
          local_1b9 = 0;
          *local_a8 = &in_stack_fffffffffffffd30->super_token_base;
          tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x5d7e5c);
          tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x5d7e69);
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                     in_stack_fffffffffffffd30);
        }
        std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::operator++
                  ((_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> *)
                   in_stack_fffffffffffffce0);
      }
      tree_type<cs::token_base_*>::clear((tree_type<cs::token_base_*> *)in_stack_fffffffffffffce0);
      this_01 = local_10;
      local_1c8 = (tree_node *)
                  tree_type<cs::token_base_*>::root
                            ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffcd8);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::front
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_fffffffffffffcf0);
      local_1d0 = (tree_node *)
                  tree_type<cs::token_base*>::emplace_root_left<cs::token_base*&>
                            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,
                             in_stack_fffffffffffffd38.mData);
      this_02 = local_10;
      local_1d8 = (tree_node *)
                  tree_type<cs::token_base_*>::root
                            ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffcd8);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::front
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_fffffffffffffcf0);
      local_1e0 = (tree_node *)
                  tree_type<cs::token_base*>::emplace_left_left<cs::token_base*&>
                            ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd30,
                             in_stack_fffffffffffffd38,(token_base **)this_02);
      local_1e8 = 1;
      do {
        uVar1 = local_1e8;
        sVar5 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                          ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x5d7fde);
        if (sVar5 <= uVar1) {
          local_270 = tree_type<cs::token_base_*>::root
                                ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffcd8);
          while( true ) {
            bVar2 = tree_type<cs::token_base_*>::iterator::usable(&local_270);
            if (!bVar2) {
              return;
            }
            local_278 = tree_type<cs::token_base_*>::iterator::right((iterator *)this_02);
            bVar2 = tree_type<cs::token_base_*>::iterator::usable(&local_278);
            if (((bVar2 ^ 0xffU) & 1) != 0) break;
            local_270 = tree_type<cs::token_base_*>::iterator::right((iterator *)this_02);
          }
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                     in_stack_fffffffffffffcf0);
          tree_type<cs::token_base*>::emplace_right_right<cs::token_base*&>
                    ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd30,
                     in_stack_fffffffffffffd38,(token_base **)this_02);
          return;
        }
        local_1f0 = tree_type<cs::token_base_*>::root
                              ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffcd8);
        while (bVar2 = tree_type<cs::token_base_*>::iterator::usable(&local_1f0), bVar2) {
          local_1f8 = tree_type<cs::token_base_*>::iterator::right((iterator *)this_02);
          bVar2 = tree_type<cs::token_base_*>::iterator::usable(&local_1f8);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            local_200 = local_1f0.mData;
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
            local_208 = (tree_node *)
                        tree_type<cs::token_base*>::emplace_right_right<cs::token_base*&>
                                  ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd30,
                                   in_stack_fffffffffffffd38,(token_base **)this_02);
            break;
          }
          local_210 = (tree_node *)tree_type<cs::token_base_*>::iterator::right((iterator *)this_02)
          ;
          local_1f0 = (iterator)local_210;
        }
        local_218 = tree_type<cs::token_base_*>::root
                              ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffcd8);
        while (bVar2 = tree_type<cs::token_base_*>::iterator::usable(&local_218), bVar2) {
          local_220 = tree_type<cs::token_base_*>::iterator::right((iterator *)this_02);
          bVar2 = tree_type<cs::token_base_*>::iterator::usable(&local_220);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            local_228 = local_218.mData;
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
            local_230 = (tree_node *)
                        tree_type<cs::token_base*>::emplace_root_left<cs::token_base*&>
                                  (in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,
                                   in_stack_fffffffffffffd38.mData);
            break;
          }
          tree_type<cs::token_base_*>::iterator::data((iterator *)this_01);
          iVar3 = get_signal_level(this_00,in_stack_fffffffffffffd58);
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                     in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
          iVar4 = get_signal_level(this_00,in_stack_fffffffffffffd58);
          if (iVar3 == iVar4) {
            tree_type<cs::token_base_*>::iterator::data((iterator *)this_01);
            bVar2 = is_left_associative(this_00,in_stack_fffffffffffffd58);
            if (bVar2) {
              local_238 = local_218.mData;
              std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                        ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                         in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
              local_240 = (tree_node *)
                          tree_type<cs::token_base*>::emplace_right_left<cs::token_base*&>
                                    ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd30,
                                     in_stack_fffffffffffffd38,(token_base **)this_02);
            }
            else {
              local_248 = local_218.mData;
              in_stack_fffffffffffffcf0 = local_10;
              std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                        ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                         in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
              local_250 = (tree_node *)
                          tree_type<cs::token_base*>::emplace_root_left<cs::token_base*&>
                                    (in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,
                                     in_stack_fffffffffffffd38.mData);
            }
            break;
          }
          tree_type<cs::token_base_*>::iterator::data((iterator *)this_01);
          iVar3 = get_signal_level(this_00,in_stack_fffffffffffffd58);
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                     in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
          iVar4 = get_signal_level(this_00,in_stack_fffffffffffffd58);
          if (iVar4 < iVar3) {
            local_258 = local_218.mData;
            in_stack_fffffffffffffce0 = local_10;
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_10,
                       (size_type)in_stack_fffffffffffffcd8);
            local_260 = (tree_node *)
                        tree_type<cs::token_base*>::emplace_root_left<cs::token_base*&>
                                  (in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,
                                   in_stack_fffffffffffffd38.mData);
            break;
          }
          local_268 = (tree_node *)tree_type<cs::token_base_*>::iterator::right((iterator *)this_02)
          ;
          local_218 = (iterator)local_268;
        }
        local_1e8 = local_1e8 + 1;
      } while( true );
    }
  }
  local_55 = 1;
  uVar6 = __cxa_allocate_exception(0x28);
  paVar7 = &local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Unexpected grammar when building expression tree.",paVar7);
  compile_error::compile_error(in_stack_fffffffffffffce0,(string *)in_stack_fffffffffffffcd8);
  local_55 = 0;
  __cxa_throw(uVar6,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

void compiler_type::build_tree(tree_type<token_base *> &tree, std::deque<token_base *> &signals,
	                               std::deque<token_base *> &objects)
	{
		if (objects.empty() || signals.empty() || objects.size() != signals.size() + 1)
			throw compile_error("Unexpected grammar when building expression tree.");
		for (auto &obj: objects) {
			if (obj != nullptr && obj->get_type() == token_types::sblist) {
				auto *sbl = static_cast<token_sblist *>(obj);
				std::deque<token_base *> tokens;
				for (auto &list: sbl->get_list()) {
					for (auto &it: list)
						tokens.push_back(it);
					tokens.push_back(new token_signal(signal_types::com_));
				}
				tokens.pop_back();
				tree_type<token_base *> t;
				gen_tree(t, tokens);
				obj = new token_expr(t);
			}
		}
		tree.clear();
		tree.emplace_root_left(tree.root(), signals.front());
		tree.emplace_left_left(tree.root(), objects.front());
		for (std::size_t i = 1; i < signals.size(); ++i) {
			for (typename tree_type<token_base *>::iterator it = tree.root(); it.usable(); it = it.right()) {
				if (!it.right().usable()) {
					tree.emplace_right_right(it, objects.at(i));
					break;
				}
			}
			for (typename tree_type<token_base *>::iterator it = tree.root(); it.usable(); it = it.right()) {
				if (!it.right().usable()) {
					tree.emplace_root_left(it, signals.at(i));
					break;
				}
				if (get_signal_level(it.data()) == get_signal_level(signals.at(i))) {
					if (is_left_associative(it.data()))
						tree.emplace_right_left(it, signals.at(i));
					else
						tree.emplace_root_left(it, signals.at(i));
					break;
				}
				if (get_signal_level(it.data()) > get_signal_level(signals.at(i))) {
					tree.emplace_root_left(it, signals.at(i));
					break;
				}
			}
		}
		for (typename tree_type<token_base *>::iterator it = tree.root(); it.usable(); it = it.right()) {
			if (!it.right().usable()) {
				tree.emplace_right_right(it, objects.back());
				break;
			}
		}
	}